

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O3

QAccessibleInterface * __thiscall QAccessibleWidget::focusChild(QAccessibleWidget *this)

{
  bool bVar1;
  QWidget *pQVar2;
  QWidget *pQVar3;
  QAccessibleInterface *pQVar4;
  QWidget *pQVar5;
  QAccessibleWidget *pQVar6;
  long lVar7;
  QWidget *pQVar8;
  
  pQVar2 = (QWidget *)(**(code **)(*(long *)this + 0x18))();
  pQVar3 = (QWidget *)0x0;
  if ((*(byte *)(*(long *)&pQVar2->field_0x8 + 0x30) & 1) != 0) {
    pQVar3 = pQVar2;
  }
  bVar1 = QWidget::hasFocus(pQVar3);
  pQVar3 = (QWidget *)(**(code **)(*(long *)this + 0x18))(this);
  if (bVar1) {
    pQVar4 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface((QObject *)pQVar3);
    return pQVar4;
  }
  if ((*(byte *)(*(long *)&pQVar3->field_0x8 + 0x30) & 1) == 0) {
    pQVar3 = (QWidget *)0x0;
  }
  pQVar3 = QWidget::focusWidget(pQVar3);
  if (pQVar3 == (QWidget *)0x0) {
    return (QAccessibleInterface *)0x0;
  }
  pQVar5 = (QWidget *)(**(code **)(*(long *)this + 0x18))(this);
  pQVar2 = pQVar3;
  if (pQVar5 == (QWidget *)0x0) {
    pQVar8 = (QWidget *)0x0;
  }
  else {
    pQVar8 = (QWidget *)0x0;
    if ((*(byte *)(*(long *)&pQVar5->field_0x8 + 0x30) & 1) != 0) {
      pQVar8 = pQVar5;
    }
    if (pQVar3 == pQVar8) goto LAB_0051a4f1;
  }
  do {
    pQVar2 = *(QWidget **)(*(long *)&pQVar2->field_0x8 + 0x10);
    if (pQVar2 == pQVar8) break;
  } while (pQVar2 != (QWidget *)0x0);
  if (pQVar2 == (QWidget *)0x0) {
    return (QAccessibleInterface *)0x0;
  }
LAB_0051a4f1:
  pQVar6 = (QAccessibleWidget *)QAccessible::queryAccessibleInterface(&pQVar3->super_QObject);
  if ((pQVar6 != this && pQVar6 != (QAccessibleWidget *)0x0) &&
     (lVar7 = (**(code **)(*(long *)pQVar6 + 0x30))(pQVar6), lVar7 != 0)) {
    pQVar4 = (QAccessibleInterface *)(**(code **)(*(long *)pQVar6 + 0x30))(pQVar6);
    return pQVar4;
  }
  return (QAccessibleInterface *)pQVar6;
}

Assistant:

QAccessibleInterface *QAccessibleWidget::focusChild() const
{
    if (widget()->hasFocus())
        return QAccessible::queryAccessibleInterface(object());

    QWidget *fw = widget()->focusWidget();
    if (!fw)
        return nullptr;

    if (isAncestor(widget(), fw)) {
        QAccessibleInterface *iface = QAccessible::queryAccessibleInterface(fw);
        if (!iface || iface == this || !iface->focusChild())
            return iface;
        return iface->focusChild();
    }
    return nullptr;
}